

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

float __thiscall ON_XMLVariant::AsFloat(ON_XMLVariant *this)

{
  ON_XMLVariantPrivate *pOVar1;
  bool bVar2;
  wchar_t *s;
  float fVar3;
  double dVar4;
  
  pOVar1 = this->_private;
  fVar3 = 0.0;
  switch(pOVar1->_type) {
  case Bool:
    fVar3 = 0.0;
    if ((pOVar1->field_2)._bool_val != false) {
      fVar3 = 1.0;
    }
    break;
  case Integer:
    fVar3 = (float)(pOVar1->field_2)._int_val;
    break;
  case Float:
    fVar3 = (pOVar1->field_2)._float_val;
    break;
  case Double:
    fVar3 = (float)(pOVar1->field_2)._double_val;
    break;
  case String:
    bVar2 = IsValidRealNumber(&pOVar1->_string_val);
    fVar3 = 0.0;
    if (bVar2) {
      s = ON_wString::operator_cast_to_wchar_t_(&this->_private->_string_val);
      dVar4 = ON_wtof(s);
      fVar3 = (float)dVar4;
    }
  }
  return fVar3;
}

Assistant:

float ON_XMLVariant::AsFloat(void) const
{
  switch (_private->_type)
  {
  case Types::Bool:    return       _private->_bool_val ? 1.0f : 0.0f;
  case Types::Float:   return       _private->_float_val;
  case Types::Double:  return float(_private->_double_val);
  case Types::Integer: return float(_private->_int_val);
  case Types::String:
    if (IsValidRealNumber(_private->_string_val))
      return float(ON_wtof(_private->_string_val));

  default:
    return 0.0f;
  }
}